

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tclHash.c
# Opt level: O0

Tcl_HashEntry * OneWordCreate(Tcl_HashTable *tablePtr,char *key,int *newPtr)

{
  uint uVar1;
  Tcl_HashEntry *pTVar2;
  undefined4 *in_RDX;
  char *in_RSI;
  Tcl_HashTable *in_RDI;
  Tcl_HashTable *unaff_retaddr;
  int index;
  Tcl_HashEntry *hPtr;
  Tcl_HashEntry *local_28;
  
  uVar1 = (uint)((long)in_RSI * 0x41c64e6d >> ((byte)in_RDI->downShift & 0x3f)) & in_RDI->mask;
  local_28 = in_RDI->buckets[(int)uVar1];
  while( true ) {
    if (local_28 == (Tcl_HashEntry *)0x0) {
      *in_RDX = 1;
      pTVar2 = (Tcl_HashEntry *)malloc(0x28);
      pTVar2->tablePtr = in_RDI;
      pTVar2->bucketPtr = in_RDI->buckets + (int)uVar1;
      pTVar2->nextPtr = *pTVar2->bucketPtr;
      pTVar2->clientData = (ClientData)0x0;
      (pTVar2->key).oneWordValue = in_RSI;
      *pTVar2->bucketPtr = pTVar2;
      in_RDI->numEntries = in_RDI->numEntries + 1;
      if (in_RDI->rebuildSize <= in_RDI->numEntries) {
        RebuildTable(unaff_retaddr);
      }
      return pTVar2;
    }
    if ((local_28->key).oneWordValue == in_RSI) break;
    local_28 = local_28->nextPtr;
  }
  *in_RDX = 0;
  return local_28;
}

Assistant:

static Tcl_HashEntry *
OneWordCreate(Tcl_HashTable *tablePtr, register char *key, int *newPtr)
{
    register Tcl_HashEntry *hPtr;
    int index;

    index = RANDOM_INDEX(tablePtr, key);

    /* 
     * Search all of the entries in this bucket.
     */

    for (hPtr = tablePtr->buckets[index]; hPtr != NULL;
	 hPtr = hPtr->nextPtr) {
	if (hPtr->key.oneWordValue == key) {
	    *newPtr = 0;
	    return hPtr;
	}
    }

    /* 
     * Entry not found.  Add a new one to the bucket.
     */

    *newPtr = 1;
    hPtr = (Tcl_HashEntry *) malloc(sizeof(Tcl_HashEntry));
    hPtr->tablePtr = tablePtr;
    hPtr->bucketPtr = &(tablePtr->buckets[index]);
    hPtr->nextPtr = *hPtr->bucketPtr;
    hPtr->clientData = 0;
    hPtr->key.oneWordValue = key;
    *hPtr->bucketPtr = hPtr;
    tablePtr->numEntries++;

    /* 
     * If the table has exceeded a decent size, rebuild it with many
     * more buckets.
     */

    if (tablePtr->numEntries >= tablePtr->rebuildSize) {
	RebuildTable(tablePtr);
    }
    return hPtr;
}